

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnBrTableExpr
          (BinaryReaderIR *this,Index num_targets,Index *target_depths,Index default_target_depth)

{
  Index index;
  Result RVar1;
  long lVar2;
  pointer *__ptr;
  Expr *local_b8;
  _Head_base<0UL,_wabt::Expr_*,_false> local_a0;
  Location local_98;
  Var local_78;
  
  std::make_unique<wabt::BrTableExpr>();
  GetLocation(&local_98,this);
  Var::Var(&local_78,default_target_depth,&local_98);
  Var::operator=((Var *)&local_b8[1].loc,&local_78);
  Var::~Var(&local_78);
  std::vector<wabt::Var,_std::allocator<wabt::Var>_>::resize
            ((vector<wabt::Var,_std::allocator<wabt::Var>_> *)(local_b8 + 1),(ulong)num_targets);
  for (lVar2 = 0; (ulong)num_targets * 0x48 - lVar2 != 0; lVar2 = lVar2 + 0x48) {
    index = *target_depths;
    GetLocation(&local_98,this);
    Var::Var(&local_78,index,&local_98);
    Var::operator=((Var *)((long)local_b8[1]._vptr_Expr + lVar2),&local_78);
    Var::~Var(&local_78);
    target_depths = target_depths + 1;
  }
  local_a0._M_head_impl = local_b8;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_a0);
  if (local_a0._M_head_impl != (Expr *)0x0) {
    (*(local_a0._M_head_impl)->_vptr_Expr[1])();
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnBrTableExpr(Index num_targets,
                                     Index* target_depths,
                                     Index default_target_depth) {
  auto expr = std::make_unique<BrTableExpr>();
  expr->default_target = Var(default_target_depth, GetLocation());
  expr->targets.resize(num_targets);
  for (Index i = 0; i < num_targets; ++i) {
    expr->targets[i] = Var(target_depths[i], GetLocation());
  }
  return AppendExpr(std::move(expr));
}